

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::EncryptAes256Cbc
          (ByteData *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *iv,string *data)

{
  uint32_t size;
  uint8_t *buffer;
  ByteData local_80;
  ByteData local_58;
  undefined1 local_40 [8];
  ByteData byte_data;
  string *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *iv_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  
  byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  buffer = (uint8_t *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  ByteData::ByteData((ByteData *)local_40,buffer,size);
  ByteData::ByteData(&local_58,key);
  ByteData::ByteData(&local_80,iv);
  EncryptAes256Cbc(__return_storage_ptr__,&local_58,&local_80,(ByteData *)local_40);
  ByteData::~ByteData(&local_80);
  ByteData::~ByteData(&local_58);
  ByteData::~ByteData((ByteData *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::EncryptAes256Cbc(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &iv,
    const std::string &data) {
  ByteData byte_data(
      reinterpret_cast<const uint8_t *>(data.data()),
      static_cast<uint32_t>(data.size()));
  return EncryptAes256Cbc(ByteData(key), ByteData(iv), byte_data);
}